

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

void Gia_ManSimLogStats(Gia_Man_t *p,char *pDumpFile,int Total,int Correct,int Guess)

{
  uint uVar1;
  FILE *__s;
  
  __s = fopen(pDumpFile,"wb");
  fwrite("{\n",2,1,__s);
  fprintf(__s,"    \"name\" : \"%s\",\n",p->pName);
  fprintf(__s,"    \"input\" : %d,\n",(ulong)(uint)p->vCis->nSize);
  fprintf(__s,"    \"output\" : %d,\n",(ulong)(uint)p->vCos->nSize);
  fprintf(__s,"    \"and\" : %d,\n",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  uVar1 = Gia_ManLevelNum(p);
  fprintf(__s,"    \"level\" : %d,\n",(ulong)uVar1);
  fprintf(__s,"    \"total\" : %d,\n",(ulong)(uint)Total);
  fprintf(__s,"    \"correct\" : %d,\n",(ulong)(uint)Correct);
  fprintf(__s,"    \"guess\" : %d\n",(ulong)(uint)Guess);
  fwrite("}\n",2,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Gia_ManSimLogStats( Gia_Man_t * p, char * pDumpFile, int Total, int Correct, int Guess )
{
    FILE * pTable = fopen( pDumpFile, "wb" );
    fprintf( pTable, "{\n" );
    fprintf( pTable, "    \"name\" : \"%s\",\n", p->pName );
    fprintf( pTable, "    \"input\" : %d,\n",    Gia_ManCiNum(p) );
    fprintf( pTable, "    \"output\" : %d,\n",   Gia_ManCoNum(p) );
    fprintf( pTable, "    \"and\" : %d,\n",      Gia_ManAndNum(p) );
    fprintf( pTable, "    \"level\" : %d,\n",    Gia_ManLevelNum(p) );
    fprintf( pTable, "    \"total\" : %d,\n",    Total );
    fprintf( pTable, "    \"correct\" : %d,\n",  Correct );
    fprintf( pTable, "    \"guess\" : %d\n",     Guess );
    fprintf( pTable, "}\n" );
    fclose( pTable );
}